

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O0

bool __thiscall SVGChart::LinTickIterator::Init(LinTickIterator *this)

{
  float fVar1;
  bool bVar2;
  double dVar3;
  int theDiv;
  float theMajorTickSpan;
  float theMin;
  LinTickIterator *this_local;
  
  bVar2 = (this->super_TickIterator).mAxisSetup != (AxisSetup *)0x0;
  if (bVar2) {
    fVar1 = ((this->super_TickIterator).mAxisSetup)->mMin;
    this->mDelta = (((this->super_TickIterator).mAxisSetup)->mTickInfo).mMajorTickSpan /
                   (float)(((this->super_TickIterator).mAxisSetup)->mTickInfo).mTickDivision;
    dVar3 = std::ceil((double)(ulong)(uint)(fVar1 / this->mDelta));
    this->mCount = (long)SUB84(dVar3,0);
    this->mCurrentTick = (float)this->mCount * this->mDelta;
    std::__cxx11::string::operator=
              ((string *)&this->mFormatString,
               (string *)&(((this->super_TickIterator).mAxisSetup)->mTickInfo).mFormatString);
  }
  return bVar2;
}

Assistant:

bool LinTickIterator::Init () {
      if (!mAxisSetup) {
        return false;
      }

      float theMin = mAxisSetup->mMin;
      float theMajorTickSpan = mAxisSetup->mTickInfo.mMajorTickSpan;
      int theDiv = mAxisSetup->mTickInfo.mTickDivision;
      mDelta = theMajorTickSpan/theDiv;
      mCount = ceil (theMin/mDelta);
      mCurrentTick = mCount*mDelta;

      mFormatString = mAxisSetup->mTickInfo.mFormatString;

      return true;

    }